

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcMaterialDefinitionRepresentation::~IfcMaterialDefinitionRepresentation
          (IfcMaterialDefinitionRepresentation *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  pointer pLVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x853830;
  *(undefined8 *)&this->field_0x90 = 0x853858;
  pLVar3 = (this->super_IfcProductRepresentation).Representations.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar3 != (pointer)0x0) {
    operator_delete(pLVar3,(long)(this->super_IfcProductRepresentation).Representations.
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar3);
  }
  pcVar4 = (this->super_IfcProductRepresentation).Description.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcProductRepresentation).Description.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  puVar5 = *(undefined1 **)
            &(this->super_IfcProductRepresentation).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.field_0x10;
  puVar2 = &(this->super_IfcProductRepresentation).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.field_0x20;
  if (puVar5 != puVar2) {
    operator_delete(puVar5,*(long *)puVar2 + 1);
  }
  operator_delete(this,0xa8);
  return;
}

Assistant:

IfcMaterialDefinitionRepresentation() : Object("IfcMaterialDefinitionRepresentation") {}